

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sendf.c
# Opt level: O0

CURLcode cr_in_read(Curl_easy *data,Curl_creader *reader,char *buf,size_t blen,size_t *pnread,
                   _Bool *peos)

{
  void *pvVar1;
  size_t *psVar2;
  curl_off_t remain;
  size_t nread;
  cr_in_ctx *ctx;
  _Bool *peos_local;
  size_t *pnread_local;
  size_t blen_local;
  char *buf_local;
  Curl_creader *reader_local;
  Curl_easy *data_local;
  
  pvVar1 = reader->ctx;
  *(byte *)((long)pvVar1 + 0x44) = *(byte *)((long)pvVar1 + 0x44) & 0xf7;
  if ((*(byte *)((long)pvVar1 + 0x44) >> 1 & 1) == 0) {
    if ((*(byte *)((long)pvVar1 + 0x44) & 1) == 0) {
      pnread_local = (size_t *)blen;
      if (-1 < *(long *)((long)pvVar1 + 0x30)) {
        psVar2 = (size_t *)(*(long *)((long)pvVar1 + 0x30) - *(long *)((long)pvVar1 + 0x38));
        if ((long)psVar2 < 1) {
          pnread_local = (size_t *)0x0;
        }
        else {
          pnread_local = (size_t *)blen;
          if ((long)psVar2 < (long)blen) {
            pnread_local = psVar2;
          }
        }
      }
      remain = 0;
      if ((*(long *)((long)pvVar1 + 0x20) != 0) && (pnread_local != (size_t *)0x0)) {
        Curl_set_in_callback(data,true);
        remain = (**(code **)((long)pvVar1 + 0x20))
                           (buf,1,pnread_local,*(undefined8 *)((long)pvVar1 + 0x28));
        Curl_set_in_callback(data,false);
        *(byte *)((long)pvVar1 + 0x44) = *(byte *)((long)pvVar1 + 0x44) & 0xfb | 4;
      }
      if (remain == 0) {
        if ((-1 < *(long *)((long)pvVar1 + 0x30)) &&
           (*(long *)((long)pvVar1 + 0x38) < *(long *)((long)pvVar1 + 0x30))) {
          Curl_failf(data,"client read function EOF fail, only %ld/%ld of needed bytes read",
                     *(undefined8 *)((long)pvVar1 + 0x38),*(undefined8 *)((long)pvVar1 + 0x30));
          return CURLE_READ_ERROR;
        }
        *pnread = 0;
        *peos = true;
        *(byte *)((long)pvVar1 + 0x44) = *(byte *)((long)pvVar1 + 0x44) & 0xfe | 1;
      }
      else {
        if (remain == 0x10000000) {
          Curl_failf(data,"operation aborted by callback");
          *pnread = 0;
          *peos = false;
          *(byte *)((long)pvVar1 + 0x44) = *(byte *)((long)pvVar1 + 0x44) & 0xfd | 2;
          *(undefined4 *)((long)pvVar1 + 0x40) = 0x2a;
          return CURLE_ABORTED_BY_CALLBACK;
        }
        if (remain == 0x10000001) {
          if ((data->conn->handler->flags & 0x10) != 0) {
            Curl_failf(data,"Read callback asked for PAUSE when not supported");
            return CURLE_READ_ERROR;
          }
          if ((((data != (Curl_easy *)0x0) &&
               ((*(ulong *)&(data->set).field_0x89c >> 0x1e & 1) != 0)) &&
              (((data->state).feat == (curl_trc_feat *)0x0 || (0 < ((data->state).feat)->log_level))
              )) && (0 < Curl_trc_feat_read.log_level)) {
            Curl_trc_read(data,"cr_in_read, callback returned CURL_READFUNC_PAUSE");
          }
          *(byte *)((long)pvVar1 + 0x44) = *(byte *)((long)pvVar1 + 0x44) & 0xf7 | 8;
          (data->req).keepon = (data->req).keepon | 0x20;
          *pnread = 0;
          *peos = false;
        }
        else {
          if (pnread_local < (ulong)remain) {
            Curl_failf(data,"read function returned funny value");
            *pnread = 0;
            *peos = false;
            *(byte *)((long)pvVar1 + 0x44) = *(byte *)((long)pvVar1 + 0x44) & 0xfd | 2;
            *(undefined4 *)((long)pvVar1 + 0x40) = 0x1a;
            return CURLE_READ_ERROR;
          }
          *(curl_off_t *)((long)pvVar1 + 0x38) = remain + *(long *)((long)pvVar1 + 0x38);
          if (-1 < *(long *)((long)pvVar1 + 0x30)) {
            *(byte *)((long)pvVar1 + 0x44) =
                 *(byte *)((long)pvVar1 + 0x44) & 0xfe |
                 *(long *)((long)pvVar1 + 0x30) <= *(long *)((long)pvVar1 + 0x38);
          }
          *pnread = remain;
          *peos = (*(byte *)((long)pvVar1 + 0x44) & 1) != 0;
        }
      }
      if (((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x89c >> 0x1e & 1) != 0)) &&
         ((((data->state).feat == (curl_trc_feat *)0x0 || (0 < ((data->state).feat)->log_level)) &&
          (0 < Curl_trc_feat_read.log_level)))) {
        Curl_trc_read(data,"cr_in_read(len=%zu, total=%ld, read=%ld) -> %d, nread=%zu, eos=%d",
                      pnread_local,*(undefined8 *)((long)pvVar1 + 0x30),
                      *(undefined8 *)((long)pvVar1 + 0x38),0,*pnread,(uint)(*peos & 1));
      }
      data_local._4_4_ = CURLE_OK;
    }
    else {
      *pnread = 0;
      *peos = true;
      data_local._4_4_ = CURLE_OK;
    }
  }
  else {
    *pnread = 0;
    *peos = false;
    data_local._4_4_ = *(CURLcode *)((long)pvVar1 + 0x40);
  }
  return data_local._4_4_;
}

Assistant:

static CURLcode cr_in_read(struct Curl_easy *data,
                           struct Curl_creader *reader,
                           char *buf, size_t blen,
                           size_t *pnread, bool *peos)
{
  struct cr_in_ctx *ctx = reader->ctx;
  size_t nread;

  ctx->is_paused = FALSE;

  /* Once we have errored, we will return the same error forever */
  if(ctx->errored) {
    *pnread = 0;
    *peos = FALSE;
    return ctx->error_result;
  }
  if(ctx->seen_eos) {
    *pnread = 0;
    *peos = TRUE;
    return CURLE_OK;
  }
  /* respect length limitations */
  if(ctx->total_len >= 0) {
    curl_off_t remain = ctx->total_len - ctx->read_len;
    if(remain <= 0)
      blen = 0;
    else if(remain < (curl_off_t)blen)
      blen = (size_t)remain;
  }
  nread = 0;
  if(ctx->read_cb && blen) {
    Curl_set_in_callback(data, TRUE);
    nread = ctx->read_cb(buf, 1, blen, ctx->cb_user_data);
    Curl_set_in_callback(data, FALSE);
    ctx->has_used_cb = TRUE;
  }

  switch(nread) {
  case 0:
    if((ctx->total_len >= 0) && (ctx->read_len < ctx->total_len)) {
      failf(data, "client read function EOF fail, "
            "only %"FMT_OFF_T"/%"FMT_OFF_T " of needed bytes read",
            ctx->read_len, ctx->total_len);
      return CURLE_READ_ERROR;
    }
    *pnread = 0;
    *peos = TRUE;
    ctx->seen_eos = TRUE;
    break;

  case CURL_READFUNC_ABORT:
    failf(data, "operation aborted by callback");
    *pnread = 0;
    *peos = FALSE;
    ctx->errored = TRUE;
    ctx->error_result = CURLE_ABORTED_BY_CALLBACK;
    return CURLE_ABORTED_BY_CALLBACK;

  case CURL_READFUNC_PAUSE:
    if(data->conn->handler->flags & PROTOPT_NONETWORK) {
      /* protocols that work without network cannot be paused. This is
         actually only FILE:// just now, and it cannot pause since the transfer
         is not done using the "normal" procedure. */
      failf(data, "Read callback asked for PAUSE when not supported");
      return CURLE_READ_ERROR;
    }
    /* CURL_READFUNC_PAUSE pauses read callbacks that feed socket writes */
    CURL_TRC_READ(data, "cr_in_read, callback returned CURL_READFUNC_PAUSE");
    ctx->is_paused = TRUE;
    data->req.keepon |= KEEP_SEND_PAUSE; /* mark socket send as paused */
    *pnread = 0;
    *peos = FALSE;
    break; /* nothing was read */

  default:
    if(nread > blen) {
      /* the read function returned a too large value */
      failf(data, "read function returned funny value");
      *pnread = 0;
      *peos = FALSE;
      ctx->errored = TRUE;
      ctx->error_result = CURLE_READ_ERROR;
      return CURLE_READ_ERROR;
    }
    ctx->read_len += nread;
    if(ctx->total_len >= 0)
      ctx->seen_eos = (ctx->read_len >= ctx->total_len);
    *pnread = nread;
    *peos = ctx->seen_eos;
    break;
  }
  CURL_TRC_READ(data, "cr_in_read(len=%zu, total=%"FMT_OFF_T
                ", read=%"FMT_OFF_T") -> %d, nread=%zu, eos=%d",
                blen, ctx->total_len, ctx->read_len, CURLE_OK,
                *pnread, *peos);
  return CURLE_OK;
}